

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O2

void ExtractFastKeypoints
               (Mat *anImage,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *fastPoints)

{
  pointer pKVar1;
  undefined8 uVar2;
  ostream *poVar3;
  int in_R8D;
  Ptr<cv::FastFeatureDetector> FAST;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined4 local_108 [2];
  Mat *local_100;
  undefined8 local_f8;
  Mat anImage8;
  Mat srcImage;
  _InputArray local_30;
  
  pKVar1 = (fastPoints->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((fastPoints->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
      super__Vector_impl_data._M_finish != pKVar1) {
    (fastPoints->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
    super__Vector_impl_data._M_finish = pKVar1;
  }
  cv::FastFeatureDetector::create(&FAST,10,1);
  cv::Mat::Mat(&anImage8);
  if ((*(uint *)anImage & 0xfff) == 5) {
    _srcImage = 0x2010000;
    cv::Mat::convertTo((_OutputArray *)anImage,(int)&srcImage,255.0,0.0);
  }
  else {
    cv::Mat::operator=(&anImage8,anImage);
  }
  cv::Mat::Mat(&srcImage);
  if ((_anImage8 & 0xff8) == 0) {
    local_f8 = 0;
    local_30.sz.width = 0;
    local_30.sz.height = 0;
    local_108[0] = 0x1010000;
    local_30.flags = 0x2010000;
    local_100 = &anImage8;
    local_30.obj = &srcImage;
    cv::cvtColor((cv *)local_108,&local_30,(_OutputArray *)0x8,0,in_R8D);
  }
  else {
    cv::Mat::operator=(&srcImage,&anImage8);
  }
  local_f8 = 0;
  local_108[0] = 0x1010000;
  local_100 = &srcImage;
  uVar2 = cv::noArray();
  (**(code **)(*_FAST + 0x40))(_FAST,local_108,fastPoints,uVar2);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Detected ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," FAST\n");
  cv::Mat::~Mat(&srcImage);
  cv::Mat::~Mat(&anImage8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
  return;
}

Assistant:

static
void ExtractFastKeypoints(cv::Mat const &anImage, std::vector<cv::KeyPoint> &fastPoints)
{
  fastPoints.clear();
  auto FAST = cv::FastFeatureDetector::create();

  cv::Mat anImage8;
  if (anImage.type() == CV_32F)
    anImage.convertTo(anImage8, CV_8U, 255.0);
  else
    anImage8 = anImage;

  cv::Mat srcImage;
  if (anImage8.channels() == 1)
    cv::cvtColor(anImage8, srcImage, cv::COLOR_GRAY2BGR);
  else
    srcImage = anImage8;

  FAST->detect(srcImage, fastPoints);
  std::cerr << "Detected " << fastPoints.size() << " FAST\n";
}